

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O3

compile_errcode __thiscall SwitchStatement::Action(SwitchStatement *this)

{
  Default *this_00;
  uint uVar1;
  SymbolName SVar2;
  compile_errcode cVar3;
  uint uVar4;
  int iVar5;
  SymbolType expression_type;
  SymbolType local_44;
  SwitchTable *local_40;
  Default *local_38;
  
  local_38 = &this->m_default;
  local_40 = &this->m_switch_table;
  uVar4 = 0;
  do {
    SVar2 = SymbolQueue::GetCurrentName(handle_correct_queue);
    this_00 = local_38;
    uVar1 = uVar4;
    switch(uVar4) {
    case 0:
      uVar1 = 1;
      if (SVar2 == SWITCH_SYM) goto switchD_00131fa9_default;
      iVar5 = 5;
      uVar4 = 0;
      break;
    case 1:
      uVar1 = 2;
      if (SVar2 == L_CIRCLE_BRACKET_SYM) goto switchD_00131fa9_default;
      iVar5 = 5;
      uVar4 = 1;
      break;
    case 2:
      cVar3 = Expression::Action(&this->m_expression,&local_44);
      if (cVar3 == 0) {
        Expression::LogOutput(&this->m_expression);
        uVar1 = 3;
        goto switchD_00131fa9_default;
      }
      iVar5 = 5;
      uVar4 = 2;
      break;
    case 3:
      uVar1 = 4;
      if (SVar2 == R_CIRCLE_BRACKET_SYM) goto switchD_00131fa9_default;
      iVar5 = 5;
      uVar4 = 3;
      break;
    case 4:
      uVar4 = 4;
      iVar5 = 5;
      uVar1 = 5;
      if (SVar2 == L_CURLY_BRACKET_SYM) goto switchD_00131fa9_default;
      break;
    case 5:
      cVar3 = SwitchTable::Action(local_40,&local_44);
      uVar4 = 5;
      iVar5 = 5;
      if (cVar3 == 0) {
        SwitchTable::LogOutput(local_40);
        uVar1 = 6;
        goto switchD_00131fa9_default;
      }
      break;
    case 6:
      cVar3 = Default::Action(local_38);
      if (cVar3 == 0) {
        Default::LogOutput(this_00);
        uVar1 = 7;
      }
      else {
        uVar1 = 8;
        if (SVar2 != R_CURLY_BRACKET_SYM) {
          iVar5 = 5;
          uVar4 = 6;
          break;
        }
      }
    default:
switchD_00131fa9_default:
      uVar4 = uVar1;
      iVar5 = 0;
      if ((7 < uVar4) || ((200U >> uVar4 & 1) == 0)) {
        SymbolQueue::NextSymbol(handle_correct_queue);
      }
      break;
    case 7:
      uVar1 = 8;
      if (SVar2 == R_CURLY_BRACKET_SYM) goto switchD_00131fa9_default;
      iVar5 = 5;
      uVar4 = 7;
      break;
    case 8:
      iVar5 = 1;
    }
    if (iVar5 != 0) {
      if (iVar5 == 5) {
        cVar3 = -1;
      }
      else {
        cVar3 = 0;
      }
      return cVar3;
    }
  } while( true );
}

Assistant:

compile_errcode SwitchStatement::Action() {
    int ret = COMPILE_OK;
    int state = 0;
    SymbolType expression_type;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (name == SWITCH_SYM) {
                    state = 1;
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 1: {
                if (name == L_CIRCLE_BRACKET_SYM) {
                    state = 2;
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 2: {
                if ((ret = m_expression.Action(expression_type)) == COMPILE_OK) {
                    m_expression.LogOutput();
                    state = 3;
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 3: {
                if (name == R_CIRCLE_BRACKET_SYM) {
                    state = 4;
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 4: {
                if (name == L_CURLY_BRACKET_SYM) {
                    state = 5;
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 5: {
                if ((ret = m_switch_table.Action(expression_type)) == COMPILE_OK) {
                    m_switch_table.LogOutput();
                    state = 6;
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 6: {
                if ((ret = m_default.Action()) == COMPILE_OK) {
                    m_default.LogOutput();
                    state = 7;
                    break;
                } else if (name == R_CURLY_BRACKET_SYM) {
                    state = 8;
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 7: {
                if (name == R_CURLY_BRACKET_SYM) {
                    state = 8;
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 8: return COMPILE_OK;
        }
        if (state != 3 && state != 6 && state != 7)
            handle_correct_queue->NextSymbol();
    }
    ERROR_SWITCH:
       return NOT_MATCH;
}